

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool __thiscall duckdb::RowGroupCollection::IsPersistent(RowGroupCollection *this)

{
  bool bVar1;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  RowGroup *row_group;
  
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_01 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
  if (this_01 == (RowGroup *)0x0) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = RowGroup::IsPersistent(this_01);
      if (!bVar1) {
        return bVar1;
      }
      this_01 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,this_01);
    } while (this_01 != (RowGroup *)0x0);
  }
  return bVar1;
}

Assistant:

bool RowGroupCollection::IsPersistent() const {
	for (auto &row_group : row_groups->Segments()) {
		if (!row_group.IsPersistent()) {
			return false;
		}
	}
	return true;
}